

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O0

int Aig_NodeMffcExtendCut(Aig_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vResult)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Aig_Obj_t *pNode_00;
  int local_5c;
  int ConeBest;
  int ConeCur2;
  int ConeCur1;
  int ConeSize2;
  int ConeSize1;
  int LevelMax;
  int i;
  Aig_Obj_t *pLeafBest;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vResult_local;
  Vec_Ptr_t *vLeaves_local;
  Aig_Obj_t *pNode_local;
  Aig_Man_t *p_local;
  
  ConeSize2 = 0;
  for (ConeSize1 = 0; iVar1 = Vec_PtrSize(vLeaves), ConeSize1 < iVar1; ConeSize1 = ConeSize1 + 1) {
    pvVar4 = Vec_PtrEntry(vLeaves,ConeSize1);
    ConeSize2 = Abc_MaxInt(ConeSize2,
                           (uint)((ulong)*(undefined8 *)((long)pvVar4 + 0x18) >> 0x20) & 0xffffff);
  }
  if (ConeSize2 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Aig_NodeDeref_rec(pNode,0,(float *)0x0,(float *)0x0);
    local_5c = 1000000000;
    _LevelMax = (Aig_Obj_t *)0x0;
    for (ConeSize1 = 0; iVar2 = Vec_PtrSize(vLeaves), ConeSize1 < iVar2; ConeSize1 = ConeSize1 + 1)
    {
      pNode_00 = (Aig_Obj_t *)Vec_PtrEntry(vLeaves,ConeSize1);
      if (((uint)((ulong)*(undefined8 *)&pNode_00->field_0x18 >> 0x20) & 0xffffff) == ConeSize2) {
        iVar2 = Aig_NodeDeref_rec(pNode_00,0,(float *)0x0,(float *)0x0);
        if (iVar2 < local_5c) {
          local_5c = iVar2;
          _LevelMax = pNode_00;
        }
        iVar3 = Aig_NodeRef_rec(pNode_00,0);
        if (iVar2 != iVar3) {
          __assert_fail("ConeCur1 == ConeCur2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                        ,0x123,
                        "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
      }
    }
    if (_LevelMax == (Aig_Obj_t *)0x0) {
      __assert_fail("pLeafBest != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0x125,
                    "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
      ;
    }
    iVar2 = Aig_ObjIsNode(_LevelMax);
    if (iVar2 == 0) {
      __assert_fail("Aig_ObjIsNode(pLeafBest)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0x126,
                    "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
      ;
    }
    iVar2 = Aig_NodeDeref_rec(_LevelMax,0,(float *)0x0,(float *)0x0);
    Vec_PtrClear(vResult);
    Aig_ManIncrementTravId(p);
    Aig_NodeMffcSupp_rec(p,pNode,0,vResult,1,_LevelMax);
    iVar3 = Aig_NodeRef_rec(_LevelMax,0);
    if (iVar2 != iVar3) {
      __assert_fail("ConeCur1 == ConeCur2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0x12f,
                    "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
      ;
    }
    iVar2 = Aig_NodeRef_rec(pNode,0);
    if (iVar1 != iVar2) {
      __assert_fail("ConeSize1 == ConeSize2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0x132,
                    "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
      ;
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Aig_NodeMffcExtendCut( Aig_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vResult )
{
    Aig_Obj_t * pObj, * pLeafBest;
    int i, LevelMax, ConeSize1, ConeSize2, ConeCur1, ConeCur2, ConeBest;
    // dereference the current cut
    LevelMax = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        LevelMax = Abc_MaxInt( LevelMax, (int)pObj->Level );
    if ( LevelMax == 0 )
        return 0;
    // dereference the cut
    ConeSize1 = Aig_NodeDeref_rec( pNode, 0, NULL, NULL );
    // try expanding each node in the boundary
    ConeBest = ABC_INFINITY;
    pLeafBest = NULL;
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
    {
        if ( (int)pObj->Level != LevelMax )
            continue;
        ConeCur1 = Aig_NodeDeref_rec( pObj, 0, NULL, NULL );
        if ( ConeBest > ConeCur1 )
        {
            ConeBest = ConeCur1;
            pLeafBest = pObj;
        }
        ConeCur2 = Aig_NodeRef_rec( pObj, 0 );
        assert( ConeCur1 == ConeCur2 );
    }
    assert( pLeafBest != NULL );
    assert( Aig_ObjIsNode(pLeafBest) );
    // deref the best leaf
    ConeCur1 = Aig_NodeDeref_rec( pLeafBest, 0, NULL, NULL );
    // collect the cut nodes
    Vec_PtrClear( vResult );
    Aig_ManIncrementTravId( p );
    Aig_NodeMffcSupp_rec( p, pNode, 0, vResult, 1, pLeafBest );
    // ref the nodes
    ConeCur2 = Aig_NodeRef_rec( pLeafBest, 0 );
    assert( ConeCur1 == ConeCur2 );
    // ref the original node
    ConeSize2 = Aig_NodeRef_rec( pNode, 0 );
    assert( ConeSize1 == ConeSize2 );
    return 1;
}